

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int maxIntensityBinIdx;
  int iVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  allocator local_2122;
  allocator local_2121;
  undefined4 local_2120;
  undefined4 local_211c;
  uint local_2118;
  int local_2114;
  string local_2110;
  string local_20f0;
  sigaction sa;
  char binFileName [4096];
  char idxFileName [4096];
  
  progname = *argv;
  memcpy(binFileName,"footprint.bin",0x1000);
  memcpy(idxFileName,"footprint.idx",0x1000);
  local_2114 = -1;
  local_211c = 0xffffff01;
  bVar3 = false;
  local_2118 = 0;
  local_2120 = 0xffffff01;
  do {
    iVar1 = getopt(argc,argv,"i:nb:x:zuNhv");
    maxIntensityBinIdx = local_2114;
    uVar4 = local_2118;
    switch(iVar1) {
    case 0x75:
      local_2118 = (uint)CONCAT71((int7)((ulong)((long)&switchD_001035f1::switchdataD_001043e0 +
                                                (long)(int)(&switchD_001035f1::switchdataD_001043e0)
                                                           [iVar1 - 0x75]) >> 8),1);
      break;
    case 0x76:
      fprintf(_stderr,"%s : version : %s\n",*argv,"");
LAB_0010386a:
      exit(1);
    case 0x77:
    case 0x79:
switchD_001035f1_caseD_77:
      Help();
      goto LAB_0010386a;
    case 0x78:
      strcpy(idxFileName,_optarg);
      break;
    case 0x7a:
      bVar3 = true;
      break;
    default:
      if (iVar1 == 0x62) {
        strcpy(binFileName,_optarg);
      }
      else {
        if (iVar1 == -1) {
          if (local_2114 != -1) {
            if ((local_2118 & 1) == 0) {
              if (bVar3) goto LAB_0010369e;
            }
            else {
              if (bVar3) {
LAB_0010369e:
                sVar2 = strlen(binFileName);
                if (sVar2 < 2) {
LAB_001036df:
                  sVar2 = strlen(binFileName);
                  (binFileName + sVar2)[0] = '.';
                  (binFileName + sVar2)[1] = 'z';
                  binFileName[sVar2 + 2] = '\0';
                }
                else {
                  strcpy((char *)&sa,binFileName + (sVar2 - 2));
                  iVar1 = bcmp(&sa,".z",3);
                  if (iVar1 != 0) goto LAB_001036df;
                }
                sVar2 = strlen(idxFileName);
                if (sVar2 < 2) {
LAB_0010373f:
                  sVar2 = strlen(idxFileName);
                  (idxFileName + sVar2)[0] = '.';
                  (idxFileName + sVar2)[1] = 'z';
                  idxFileName[sVar2 + 2] = '\0';
                }
                else {
                  strcpy((char *)&sa,binFileName + sVar2 + 0xffe);
                  iVar1 = bcmp(&sa,".z",3);
                  if (iVar1 != 0) goto LAB_0010373f;
                }
                bVar3 = true;
                goto LAB_00103764;
              }
              fwrite("WARNING: Zip footprint data argument not supplied. Ignoring request to include uncompressed data size in index file.\n"
                     ,0x75,1,_stderr);
              uVar4 = 0;
            }
            bVar3 = false;
LAB_00103764:
            memset(&sa,0,0x98);
            sigemptyset((sigset_t *)&sa.sa_mask);
            sa.__sigaction_handler.sa_handler = SegFaultSigAction;
            sa.sa_flags = 4;
            sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
            std::__cxx11::string::string((string *)&local_20f0,"",&local_2121);
            std::__cxx11::string::string((string *)&local_2110,"",&local_2122);
            initstreams(&local_20f0,&local_2110);
            std::__cxx11::string::~string((string *)&local_2110);
            std::__cxx11::string::~string((string *)&local_20f0);
            DoIt(maxIntensityBinIdx,(bool)((byte)local_2120 & 1),binFileName,idxFileName,
                 (bool)((byte)uVar4 & 1),bVar3,(bool)((byte)local_211c & 1));
            return 0;
          }
          fwrite("ERROR: Intensity bin parameter not supplied.\n",0x2d,1,_stderr);
          goto LAB_0010386a;
        }
        if (iVar1 == 0x4e) {
          local_211c = 0;
        }
        else if (iVar1 == 0x6e) {
          local_2120 = 0;
        }
        else {
          if (iVar1 != 0x69) goto switchD_001035f1_caseD_77;
          local_2114 = atoi(_optarg);
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  int maxIntensityBinIdx = -1;
  bool hasIntensityUncertainty = true;
  char binFileName[4096] = "footprint.bin";
  char idxFileName[4096] = "footprint.idx";
  bool zip = false;
  bool uncompressedSize = false;
  bool validationCheck = true;
  int opt;
  while ((opt = getopt(argc, argv, "i:nb:x:zuNhv")) != -1) {
    switch (opt) {
      case 'i':
        maxIntensityBinIdx = atoi(optarg);
	break;
      case 'n':
	hasIntensityUncertainty = false;
	break;
      case 'b':
	strcpy(binFileName, optarg);
	break;
      case 'x':
	strcpy(idxFileName, optarg);
	break;
      case 'z':
	zip = true;
	break;
      case 'u':
	uncompressedSize = true;
	break;
      case 'N':
	validationCheck = false;
	break;
      case 'v':
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
        fprintf(stderr, "%s : version : %s :"
			" Areaperil ID data type unsigned long long\n",
		argv[0], VERSION);
#else
	fprintf(stderr, "%s : version : %s\n", argv[0], VERSION);
#endif
        exit(EXIT_FAILURE);
      case 'h':
      default:
	Help();
	exit(EXIT_FAILURE);
    }
  }

  if (maxIntensityBinIdx == -1) {
    fprintf(stderr, "ERROR: Intensity bin parameter not supplied.\n");
    exit(EXIT_FAILURE);
  }

  if (uncompressedSize && !zip) {
    fprintf(stderr, "WARNING: Zip footprint data argument not supplied."
		    " Ignoring request to include uncompressed data size in"
		    " index file.\n");
    uncompressedSize = false;
  }

  // Ensure zip file names have .z suffix
  if (zip) {
    char endChars[3];

    if (strlen(binFileName) < 2) {
      strcat(binFileName, ".z");
    } else {
      strcpy(endChars, binFileName + (strlen(binFileName) - 2));
      if (strcmp(endChars, ".z")) strcat(binFileName, ".z");
    }

    if (strlen(idxFileName) < 2) {
      strcat(idxFileName, ".z");
    } else {
      strcpy(endChars, idxFileName + (strlen(idxFileName) - 2));
      if (strcmp(endChars, ".z")) strcat(idxFileName, ".z");
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = SegFaultSigAction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {

    initstreams();
    DoIt(maxIntensityBinIdx, hasIntensityUncertainty, binFileName, idxFileName,
	 uncompressedSize, zip, validationCheck);
    return 0;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "ERROR: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);

  }

}